

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_hexdec(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  ushort **ppuVar2;
  bool bVar3;
  int local_44;
  jx9_int64 jStack_40;
  int nLen;
  jx9_int64 iVal;
  char *zEnd;
  char *zString;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zString = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 1) {
    jx9_result_int(pCtx,-1);
  }
  else {
    jStack_40 = 0;
    iVar1 = jx9_value_is_string(*apArg);
    if (iVar1 == 0) {
      jStack_40 = jx9_value_to_int64(*(jx9_value **)zString);
    }
    else {
      zEnd = jx9_value_to_string(*(jx9_value **)zString,&local_44);
      iVal = (jx9_int64)(zEnd + local_44);
      while (zEnd < (ulong)iVal) {
        if ((byte)*zEnd < 0xc0) {
          ppuVar2 = __ctype_b_loc();
          if (((*ppuVar2)[(int)*zEnd] & 0x1000) != 0) break;
          zEnd = zEnd + 1;
        }
        else {
          do {
            zEnd = zEnd + 1;
            bVar3 = false;
            if (zEnd < (ulong)iVal) {
              bVar3 = (*zEnd & 0xc0U) == 0x80;
            }
          } while (bVar3);
        }
      }
      if (zEnd < (ulong)iVal) {
        SyHexStrToInt64(zEnd,(int)iVal - (int)zEnd,&stack0xffffffffffffffc0,(char **)0x0);
      }
    }
    jx9_result_int64(pjStack_18,jStack_40);
  }
  return 0;
}

Assistant:

static int jx9Builtin_hexdec(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zEnd;
	jx9_int64 iVal;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return -1 */
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	iVal = 0;
	if( jx9_value_is_string(apArg[0]) ){
		/* Extract the given string */
		zString = jx9_value_to_string(apArg[0], &nLen);
		/* Delimit the string */
		zEnd = &zString[nLen];
		/* Ignore non hex-stream */
		while( zString < zEnd ){
			if( (unsigned char)zString[0] >= 0xc0 ){
				/* UTF-8 stream */
				zString++;
				while( zString < zEnd && (((unsigned char)zString[0] & 0xc0) == 0x80) ){
					zString++;
				}
			}else{
				if( SyisHex(zString[0]) ){
					break;
				}
				/* Ignore */
				zString++;
			}
		}
		if( zString < zEnd ){
			/* Cast */
			SyHexStrToInt64(zString, (sxu32)(zEnd-zString), (void *)&iVal, 0);
		}
	}else{
		/* Extract as a 64-bit integer */
		iVal = jx9_value_to_int64(apArg[0]);
	}
	/* Return the number */
	jx9_result_int64(pCtx, iVal);
	return JX9_OK;
}